

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O3

void address_space_stw_internal_cached_slow_sparc64
               (uc_struct_conflict9 *uc,MemoryRegionCache *cache,hwaddr addr,uint32_t val,
               MemTxAttrs attrs,MemTxResult *result,device_endian endian)

{
  MemTxResult MVar1;
  undefined2 *puVar2;
  AddressSpace **target_as_00;
  ulong data;
  IOMMUMemoryRegion *iommu_mr;
  hwaddr l;
  AddressSpace *target_as;
  ulong uVar3;
  undefined1 local_80 [8];
  MemoryRegionSection local_78;
  
  uVar3 = 2;
  if (cache->ptr != (void *)0x0) {
    __assert_fail("!cache->ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                  ,0x7b1,
                  "MemoryRegion *address_space_translate_cached(MemoryRegionCache *, hwaddr, hwaddr *, hwaddr *, _Bool, MemTxAttrs)"
                 );
  }
  data = (ulong)val;
  target_as_00 = (AddressSpace **)(addr + cache->xlat);
  iommu_mr = (IOMMUMemoryRegion *)(cache->mrs).mr;
  if ((iommu_mr == (IOMMUMemoryRegion *)0x0) || ((iommu_mr->parent_obj).is_iommu == false)) {
LAB_00a0880d:
    if (((iommu_mr->parent_obj).ram == true) && ((iommu_mr->parent_obj).readonly != true)) {
      puVar2 = (undefined2 *)
               qemu_map_ram_ptr_sparc64
                         ((uc_struct_conflict9 *)(iommu_mr->parent_obj).uc,
                          (iommu_mr->parent_obj).ram_block,(ram_addr_t)target_as_00);
      if ((endian == DEVICE_BIG_ENDIAN) || (endian != DEVICE_LITTLE_ENDIAN)) {
        data = (ulong)(ushort)((ushort)val << 8 | (ushort)val >> 8);
      }
      *puVar2 = (short)data;
      MVar1 = 0;
      goto LAB_00a0883b;
    }
  }
  else {
    address_space_translate_iommu
              (&local_78,iommu_mr,(hwaddr *)&stack0xffffffffffffff70,
               (hwaddr *)&stack0xffffffffffffff78,(hwaddr *)&DAT_00000001,SUB81(local_80,0),
               attrs._0_1_,target_as_00,(MemTxAttrs)0x2);
    iommu_mr = (IOMMUMemoryRegion *)local_78.mr;
    if (1 < uVar3) goto LAB_00a0880d;
  }
  MVar1 = memory_region_dispatch_write_sparc64
                    (uc,&iommu_mr->parent_obj,(hwaddr)target_as_00,data,
                     (uint)(endian != DEVICE_LITTLE_ENDIAN) * 8 + MO_16,attrs);
LAB_00a0883b:
  if (result != (MemTxResult *)0x0) {
    *result = MVar1;
  }
  return;
}

Assistant:

static inline void glue(address_space_stw_internal, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs,
    MemTxResult *result, enum device_endian endian)
{
    uint8_t *ptr;
    MemoryRegion *mr;
    hwaddr l = 2;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, true, attrs);
    if (l < 2 || !memory_access_is_direct(mr, true)) {
        release_lock |= prepare_mmio_access(mr);
        r = memory_region_dispatch_write(uc, mr, addr1, val,
                                         MO_16 | devend_memop(endian), attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        switch (endian) {
        case DEVICE_LITTLE_ENDIAN:
            stw_le_p(ptr, val);
            break;
        case DEVICE_BIG_ENDIAN:
            stw_be_p(ptr, val);
            break;
        default:
            stw_p(ptr, val);
            break;
        }
        invalidate_and_set_dirty(mr, addr1, 2);
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
}